

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_layer2.c
# Opt level: O0

oonf_layer2_peer_address *
oonf_layer2_net_add_ip(oonf_layer2_net *l2net,oonf_layer2_origin *origin,netaddr *ip)

{
  avl_node *paVar1;
  oonf_layer2_peer_address *local_58;
  oonf_layer2_peer_address *local_50;
  oonf_layer2_peer_address *l2addr;
  netaddr *ip_local;
  oonf_layer2_origin *origin_local;
  oonf_layer2_net *l2net_local;
  
  paVar1 = avl_find(&l2net->local_peer_ips,ip);
  if (paVar1 == (avl_node *)0x0) {
    local_58 = (oonf_layer2_peer_address *)0x0;
  }
  else {
    local_58 = (oonf_layer2_peer_address *)&paVar1[-2].parent;
  }
  local_50 = local_58;
  if (local_58 == (oonf_layer2_peer_address *)0x0) {
    local_50 = (oonf_layer2_peer_address *)oonf_class_malloc(&_l2net_addr_class);
    if (local_50 == (oonf_layer2_peer_address *)0x0) {
      return (oonf_layer2_peer_address *)0x0;
    }
    *(avl_node **)(local_50->ip)._addr = *(avl_node **)ip->_addr;
    *(avl_node **)((long)(local_50->ip)._addr + 8) = *(avl_node **)(ip->_addr + 8);
    *(undefined2 *)&(local_50->ip)._type = *(undefined2 *)&ip->_type;
    local_50->l2net = l2net;
    (local_50->_net_node).key = local_50;
    avl_insert(&l2net->local_peer_ips,&local_50->_net_node);
    (local_50->_global_node).key = local_50;
    avl_insert(&_local_peer_ips_tree,&local_50->_global_node);
    oonf_class_event(&_l2net_addr_class,local_50,OONF_OBJECT_ADDED);
  }
  local_50->origin = origin;
  return local_50;
}

Assistant:

struct oonf_layer2_peer_address *
oonf_layer2_net_add_ip(
  struct oonf_layer2_net *l2net, const struct oonf_layer2_origin *origin, const struct netaddr *ip) {
  struct oonf_layer2_peer_address *l2addr;

  l2addr = oonf_layer2_net_get_local_ip(l2net, ip);
  if (!l2addr) {
    l2addr = oonf_class_malloc(&_l2net_addr_class);
    if (!l2addr) {
      return NULL;
    }

    /* copy data */
    memcpy(&l2addr->ip, ip, sizeof(*ip));

    /* set back reference */
    l2addr->l2net = l2net;

    /* add to tree */
    l2addr->_net_node.key = &l2addr->ip;
    avl_insert(&l2net->local_peer_ips, &l2addr->_net_node);

    l2addr->_global_node.key = &l2addr->ip;
    avl_insert(&_local_peer_ips_tree, &l2addr->_global_node);

    oonf_class_event(&_l2net_addr_class, l2addr, OONF_OBJECT_ADDED);
  }

  l2addr->origin = origin;
  return l2addr;
}